

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_genericmodel.cpp
# Opt level: O1

void __thiscall tst_GenericModel::moveRowsNewBranch(tst_GenericModel *this)

{
  long lVar1;
  char cVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  QModelIndex *pQVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  value_type args;
  GenericModel testModel;
  QModelIndex parIndex;
  QPersistentModelIndex twoIndex;
  QModelIndex destIndex;
  QSignalSpy *spyArr [2];
  ModelTest probe;
  QSignalSpy rowsAboutToBeMovedSpy;
  QSignalSpy rowsMovedSpy;
  QChar local_1ea;
  anon_union_24_3_e3d07ef4_for_data local_1e8;
  undefined8 local_1d0;
  QChar local_1c2;
  anon_union_24_3_e3d07ef4_for_data local_1c0;
  QModelIndex local_1a8;
  QModelIndex local_190;
  QPersistentModelIndex local_178 [8];
  QModelIndex local_170;
  QSignalSpy *local_158 [3];
  undefined **local_140 [2];
  QSignalSpy local_130;
  QSignalSpy local_b0;
  
  GenericModel::GenericModel((GenericModel *)&local_1a8,(QObject *)0x0);
  QAbstractItemModelTester::QAbstractItemModelTester
            ((QAbstractItemModelTester *)local_140,(QAbstractItemModel *)&local_1a8,QtTest,
             (QObject *)0x0);
  local_140[0] = &PTR_metaObject_001659f8;
  local_130.super_QObject = (QObject)0xff;
  local_130._1_7_ = 0xffffffffffffff;
  local_130._8_8_ = 0;
  local_130.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
  GenericModel::insertColumns((int)&local_1a8,0,(QModelIndex *)0x2);
  local_130.super_QObject = (QObject)0xff;
  local_130._1_7_ = 0xffffffffffffff;
  local_130._8_8_ = 0;
  local_130.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
  GenericModel::insertRows((int)&local_1a8,0,(QModelIndex *)0x3);
  local_130.super_QObject = (QObject)0xff;
  local_130._1_7_ = 0xffffffffffffff;
  local_130._8_8_ = 0;
  local_130.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
  GenericModel::index((int)&local_190,(int)&local_1a8,(QModelIndex *)0x1);
  local_130.super_QObject = (QObject)0xff;
  local_130._1_7_ = 0xffffffffffffff;
  local_130._8_8_ = 0;
  local_130.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
  GenericModel::index((int)&local_170,(int)&local_1a8,(QModelIndex *)0x2);
  GenericModel::insertColumns((int)&local_1a8,0,(QModelIndex *)0x2);
  GenericModel::insertRows((int)&local_1a8,0,(QModelIndex *)0x6);
  QSignalSpy::QSignalSpy
            (&local_130,(QObject *)&local_1a8,
             "2rowsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)");
  cVar2 = QTest::qVerify(local_130.sig.d.size != 0,"rowsAboutToBeMovedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x712);
  if (cVar2 != '\0') {
    QSignalSpy::QSignalSpy
              (&local_b0,(QObject *)&local_1a8,"2rowsMoved(QModelIndex, int, int, QModelIndex, int)"
              );
    cVar2 = QTest::qVerify(local_b0.sig.d.size != 0,"rowsMovedSpy.isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                           ,0x714);
    if (cVar2 != '\0') {
      pQVar7 = (QModelIndex *)0x0;
      local_158[0] = &local_130;
      local_158[1] = &local_b0;
      do {
        iVar8 = (int)&local_1a8;
        iVar9 = (int)&local_1c0;
        GenericModel::index(iVar9,iVar8,pQVar7);
        QVariant::QVariant((QVariant *)&local_1e8,(int)pQVar7);
        iVar5 = (int)&local_1e8;
        GenericModel::setData(&local_1a8,(QVariant *)&local_1c0,iVar5);
        QVariant::~QVariant((QVariant *)&local_1e8);
        GenericModel::index(iVar9,iVar8,pQVar7);
        QVariant::QVariant((QVariant *)&local_1e8,(QChar)((short)pQVar7 + L'a'));
        GenericModel::setData(&local_1a8,(QVariant *)&local_1c0,iVar5);
        QVariant::~QVariant((QVariant *)&local_1e8);
        uVar6 = (int)pQVar7 + 1;
        pQVar7 = (QModelIndex *)(ulong)uVar6;
      } while (uVar6 != 6);
      bVar3 = GenericModel::moveRows
                        (&local_1a8,(int)&local_190,2,(QModelIndex *)0x1,(int)&local_170);
      cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),"!testModel.moveRows(parIndex, 2, 1, destIndex, -1)",
                             "",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x71a);
      if (cVar2 != '\0') {
        lVar10 = 0;
        do {
          cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)local_158 + lVar10) + 0x20),0,
                                  "spy->count()","0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                  ,0x71c);
          if (cVar2 == '\0') goto LAB_001270fe;
          lVar10 = lVar10 + 8;
        } while (lVar10 != 0x10);
        bVar3 = GenericModel::moveRows
                          (&local_1a8,(int)&local_190,2,(QModelIndex *)0x1,(int)&local_170);
        cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),"!testModel.moveRows(parIndex, 2, 1, destIndex, 1)"
                               ,"",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                               ,0x71d);
        if (cVar2 != '\0') {
          lVar10 = 0;
          do {
            cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)local_158 + lVar10) + 0x20),0,
                                    "spy->count()","0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                    ,0x71f);
            if (cVar2 == '\0') goto LAB_001270fe;
            lVar10 = lVar10 + 8;
          } while (lVar10 != 0x10);
          bVar3 = GenericModel::moveRows
                            (&local_1a8,(int)&local_190,-1,(QModelIndex *)0x1,(int)&local_170);
          cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),
                                 "!testModel.moveRows(parIndex, -1, 1, destIndex, 0)","",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                 ,0x720);
          if (cVar2 != '\0') {
            lVar10 = 0;
            do {
              cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)local_158 + lVar10) + 0x20),0,
                                      "spy->count()","0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                      ,0x722);
              if (cVar2 == '\0') goto LAB_001270fe;
              lVar10 = lVar10 + 8;
            } while (lVar10 != 0x10);
            bVar3 = GenericModel::moveRows
                              (&local_1a8,(int)&local_190,6,(QModelIndex *)0x1,(int)&local_170);
            cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),
                                   "!testModel.moveRows(parIndex, 6, 1, destIndex, 0)","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                   ,0x723);
            if (cVar2 != '\0') {
              lVar10 = 0;
              do {
                cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)local_158 + lVar10) + 0x20),0,
                                        "spy->count()","0",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                        ,0x725);
                if (cVar2 == '\0') goto LAB_001270fe;
                lVar10 = lVar10 + 8;
              } while (lVar10 != 0x10);
              GenericModel::index((int)&local_1e8,(int)&local_1a8,(QModelIndex *)0x2);
              QPersistentModelIndex::QPersistentModelIndex(local_178,(QModelIndex *)&local_1e8);
              bVar4 = (bool)GenericModel::moveRows
                                      (&local_1a8,(int)&local_190,2,(QModelIndex *)0x1,
                                       (int)&local_170);
              cVar2 = QTest::qVerify(bVar4,"testModel.moveRows(parIndex, 2, 1, destIndex, 0)","",
                                     "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                     ,0x728);
              if (cVar2 != '\0') {
                iVar5 = GenericModel::rowCount(&local_1a8);
                cVar2 = QTest::qCompare(iVar5,1,"testModel.rowCount(destIndex)","1",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                        ,0x729);
                if (cVar2 != '\0') {
                  iVar5 = GenericModel::columnCount(&local_1a8);
                  cVar2 = QTest::qCompare(iVar5,2,"testModel.columnCount(destIndex)","2",
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                          ,0x72a);
                  if (cVar2 != '\0') {
                    iVar5 = GenericModel::rowCount(&local_1a8);
                    cVar2 = QTest::qCompare(iVar5,5,"testModel.rowCount(parIndex)","5",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                            ,0x72b);
                    if (cVar2 != '\0') {
                      GenericModel::index((int)&local_1c0,(int)&local_1a8,(QModelIndex *)0x0);
                      if ((long *)local_1c0._16_8_ == (long *)0x0) {
                        local_1e8.shared = (PrivateShared *)0x0;
                        local_1e8._8_8_ = (QVariant *)0x0;
                        local_1e8._16_8_ = 0;
                        local_1d0 = 2;
                      }
                      else {
                        (**(code **)(*(long *)local_1c0._16_8_ + 0x90))
                                  (&local_1e8,local_1c0._16_8_,&local_1c0,0);
                      }
                      iVar5 = QVariant::toInt((bool *)local_1e8.data);
                      cVar2 = QTest::qCompare(iVar5,2,
                                              "testModel.index(0, 0, destIndex).data().toInt()","2",
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                              ,0x72c);
                      QVariant::~QVariant((QVariant *)&local_1e8);
                      if (cVar2 != '\0') {
                        GenericModel::index((int)&local_1c0,(int)&local_1a8,(QModelIndex *)0x0);
                        if ((long *)local_1c0._16_8_ == (long *)0x0) {
                          local_1e8.shared = (PrivateShared *)0x0;
                          local_1e8._8_8_ = (QVariant *)0x0;
                          local_1e8._16_8_ = 0;
                          local_1d0 = 2;
                        }
                        else {
                          (**(code **)(*(long *)local_1c0._16_8_ + 0x90))
                                    (&local_1e8,local_1c0._16_8_,&local_1c0,0);
                        }
                        iVar5 = QVariant::toInt((bool *)local_1e8.data);
                        cVar2 = QTest::qCompare(iVar5,0,
                                                "testModel.index(0, 0, parIndex).data().toInt()","0"
                                                ,
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                ,0x72d);
                        QVariant::~QVariant((QVariant *)&local_1e8);
                        if (cVar2 != '\0') {
                          GenericModel::index((int)&local_1c0,(int)&local_1a8,(QModelIndex *)0x1);
                          if ((long *)local_1c0._16_8_ == (long *)0x0) {
                            local_1e8.shared = (PrivateShared *)0x0;
                            local_1e8._8_8_ = (QVariant *)0x0;
                            local_1e8._16_8_ = 0;
                            local_1d0 = 2;
                          }
                          else {
                            (**(code **)(*(long *)local_1c0._16_8_ + 0x90))
                                      (&local_1e8,local_1c0._16_8_,&local_1c0,0);
                          }
                          iVar5 = QVariant::toInt((bool *)local_1e8.data);
                          cVar2 = QTest::qCompare(iVar5,1,
                                                  "testModel.index(1, 0, parIndex).data().toInt()",
                                                  "1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x72e);
                          QVariant::~QVariant((QVariant *)&local_1e8);
                          if (cVar2 != '\0') {
                            GenericModel::index((int)&local_1c0,(int)&local_1a8,(QModelIndex *)0x2);
                            if ((long *)local_1c0._16_8_ == (long *)0x0) {
                              local_1e8.shared = (PrivateShared *)0x0;
                              local_1e8._8_8_ = (QVariant *)0x0;
                              local_1e8._16_8_ = 0;
                              local_1d0 = 2;
                            }
                            else {
                              (**(code **)(*(long *)local_1c0._16_8_ + 0x90))
                                        (&local_1e8,local_1c0._16_8_,&local_1c0,0);
                            }
                            iVar5 = QVariant::toInt((bool *)local_1e8.data);
                            cVar2 = QTest::qCompare(iVar5,3,
                                                  "testModel.index(2, 0, parIndex).data().toInt()",
                                                  "3",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x72f);
                            QVariant::~QVariant((QVariant *)&local_1e8);
                            if (cVar2 != '\0') {
                              GenericModel::index((int)&local_1c0,(int)&local_1a8,(QModelIndex *)0x3
                                                 );
                              if ((long *)local_1c0._16_8_ == (long *)0x0) {
                                local_1e8.shared = (PrivateShared *)0x0;
                                local_1e8._8_8_ = (QVariant *)0x0;
                                local_1e8._16_8_ = 0;
                                local_1d0 = 2;
                              }
                              else {
                                (**(code **)(*(long *)local_1c0._16_8_ + 0x90))
                                          (&local_1e8,local_1c0._16_8_,&local_1c0,0);
                              }
                              iVar5 = QVariant::toInt((bool *)local_1e8.data);
                              cVar2 = QTest::qCompare(iVar5,4,
                                                  "testModel.index(3, 0, parIndex).data().toInt()",
                                                  "4",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x730);
                              QVariant::~QVariant((QVariant *)&local_1e8);
                              if (cVar2 != '\0') {
                                GenericModel::index((int)&local_1c0,(int)&local_1a8,
                                                    (QModelIndex *)0x4);
                                if ((long *)local_1c0._16_8_ == (long *)0x0) {
                                  local_1e8.shared = (PrivateShared *)0x0;
                                  local_1e8._8_8_ = (QVariant *)0x0;
                                  local_1e8._16_8_ = 0;
                                  local_1d0 = 2;
                                }
                                else {
                                  (**(code **)(*(long *)local_1c0._16_8_ + 0x90))
                                            (&local_1e8,local_1c0._16_8_,&local_1c0,0);
                                }
                                iVar5 = QVariant::toInt((bool *)local_1e8.data);
                                cVar2 = QTest::qCompare(iVar5,5,
                                                  "testModel.index(4, 0, parIndex).data().toInt()",
                                                  "5",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x731);
                                QVariant::~QVariant((QVariant *)&local_1e8);
                                if (cVar2 != '\0') {
                                  GenericModel::index((int)&local_1c0,(int)&local_1a8,
                                                      (QModelIndex *)0x0);
                                  if ((long *)local_1c0._16_8_ == (long *)0x0) {
                                    local_1e8.shared = (PrivateShared *)0x0;
                                    local_1e8._8_8_ = (QVariant *)0x0;
                                    local_1e8._16_8_ = 0;
                                    local_1d0 = 2;
                                  }
                                  else {
                                    (**(code **)(*(long *)local_1c0._16_8_ + 0x90))
                                              (&local_1e8,local_1c0._16_8_,&local_1c0,0);
                                  }
                                  local_1ea = QVariant::value<QChar>((QVariant *)&local_1e8);
                                  local_1c2.ucs = L'c';
                                  bVar4 = QTest::qCompare<QChar,QChar>
                                                    (&local_1ea,&local_1c2,
                                                                                                          
                                                  "testModel.index(0, 1, destIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'c\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x732);
                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                  if (bVar4) {
                                    GenericModel::index((int)&local_1c0,(int)&local_1a8,
                                                        (QModelIndex *)0x0);
                                    if ((long *)local_1c0._16_8_ == (long *)0x0) {
                                      local_1e8.shared = (PrivateShared *)0x0;
                                      local_1e8._8_8_ = (QVariant *)0x0;
                                      local_1e8._16_8_ = 0;
                                      local_1d0 = 2;
                                    }
                                    else {
                                      (**(code **)(*(long *)local_1c0._16_8_ + 0x90))
                                                (&local_1e8,local_1c0._16_8_,&local_1c0,0);
                                    }
                                    local_1ea = QVariant::value<QChar>((QVariant *)&local_1e8);
                                    local_1c2.ucs = L'a';
                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                      (&local_1ea,&local_1c2,
                                                                                                              
                                                  "testModel.index(0, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'a\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x733);
                                    QVariant::~QVariant((QVariant *)&local_1e8);
                                    if (bVar4) {
                                      GenericModel::index((int)&local_1c0,(int)&local_1a8,
                                                          (QModelIndex *)0x1);
                                      if ((long *)local_1c0._16_8_ == (long *)0x0) {
                                        local_1e8.shared = (PrivateShared *)0x0;
                                        local_1e8._8_8_ = (QVariant *)0x0;
                                        local_1e8._16_8_ = 0;
                                        local_1d0 = 2;
                                      }
                                      else {
                                        (**(code **)(*(long *)local_1c0._16_8_ + 0x90))
                                                  (&local_1e8,local_1c0._16_8_,&local_1c0,0);
                                      }
                                      local_1ea = QVariant::value<QChar>((QVariant *)&local_1e8);
                                      local_1c2.ucs = L'b';
                                      bVar4 = QTest::qCompare<QChar,QChar>
                                                        (&local_1ea,&local_1c2,
                                                                                                                  
                                                  "testModel.index(1, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'b\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x734);
                                      QVariant::~QVariant((QVariant *)&local_1e8);
                                      if (bVar4) {
                                        GenericModel::index((int)&local_1c0,(int)&local_1a8,
                                                            (QModelIndex *)0x2);
                                        if ((long *)local_1c0._16_8_ == (long *)0x0) {
                                          local_1e8.shared = (PrivateShared *)0x0;
                                          local_1e8._8_8_ = (QVariant *)0x0;
                                          local_1e8._16_8_ = 0;
                                          local_1d0 = 2;
                                        }
                                        else {
                                          (**(code **)(*(long *)local_1c0._16_8_ + 0x90))
                                                    (&local_1e8,local_1c0._16_8_,&local_1c0,0);
                                        }
                                        local_1ea = QVariant::value<QChar>((QVariant *)&local_1e8);
                                        local_1c2.ucs = L'd';
                                        bVar4 = QTest::qCompare<QChar,QChar>
                                                          (&local_1ea,&local_1c2,
                                                                                                                      
                                                  "testModel.index(2, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'d\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x735);
                                        QVariant::~QVariant((QVariant *)&local_1e8);
                                        if (bVar4) {
                                          GenericModel::index((int)&local_1c0,(int)&local_1a8,
                                                              (QModelIndex *)0x3);
                                          if ((long *)local_1c0._16_8_ == (long *)0x0) {
                                            local_1e8.shared = (PrivateShared *)0x0;
                                            local_1e8._8_8_ = (QVariant *)0x0;
                                            local_1e8._16_8_ = 0;
                                            local_1d0 = 2;
                                          }
                                          else {
                                            (**(code **)(*(long *)local_1c0._16_8_ + 0x90))
                                                      (&local_1e8,local_1c0._16_8_,&local_1c0,0);
                                          }
                                          local_1ea = QVariant::value<QChar>((QVariant *)&local_1e8)
                                          ;
                                          local_1c2.ucs = L'e';
                                          bVar4 = QTest::qCompare<QChar,QChar>
                                                            (&local_1ea,&local_1c2,
                                                                                                                          
                                                  "testModel.index(3, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'e\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x736);
                                          QVariant::~QVariant((QVariant *)&local_1e8);
                                          if (bVar4) {
                                            GenericModel::index((int)&local_1c0,(int)&local_1a8,
                                                                (QModelIndex *)0x4);
                                            if ((long *)local_1c0._16_8_ == (long *)0x0) {
                                              local_1e8.shared = (PrivateShared *)0x0;
                                              local_1e8._8_8_ = (QVariant *)0x0;
                                              local_1e8._16_8_ = 0;
                                              local_1d0 = 2;
                                            }
                                            else {
                                              (**(code **)(*(long *)local_1c0._16_8_ + 0x90))
                                                        (&local_1e8,local_1c0._16_8_,&local_1c0,0);
                                            }
                                            local_1ea = QVariant::value<QChar>
                                                                  ((QVariant *)&local_1e8);
                                            local_1c2.ucs = L'f';
                                            bVar4 = QTest::qCompare<QChar,QChar>
                                                              (&local_1ea,&local_1c2,
                                                                                                                              
                                                  "testModel.index(4, 1, parIndex).data().value<QChar>()"
                                                  ,"QChar(QLatin1Char(\'f\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x737);
                                            QVariant::~QVariant((QVariant *)&local_1e8);
                                            if (bVar4) {
                                              QPersistentModelIndex::data((int)&local_1e8);
                                              local_1c0._0_2_ =
                                                   QVariant::value<QChar>((QVariant *)&local_1e8);
                                              local_1ea.ucs = L'c';
                                              bVar4 = QTest::qCompare<QChar,QChar>
                                                                ((QChar *)&local_1c0,&local_1ea,
                                                                 "twoIndex.data().value<QChar>()",
                                                                 "QChar(QLatin1Char(\'c\'))",
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x738);
                                              QVariant::~QVariant((QVariant *)&local_1e8);
                                              if (bVar4) {
                                                iVar5 = QPersistentModelIndex::row();
                                                cVar2 = QTest::qCompare(iVar5,0,"twoIndex.row()","0"
                                                                        ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x739);
                                                if (cVar2 != '\0') {
                                                  QPersistentModelIndex::parent();
                                                  bVar4 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                    ((QModelIndex *)&local_1e8,
                                                                     &local_170,"twoIndex.parent()",
                                                                     "destIndex",
                                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x73a);
                                                  if (bVar4) {
                                                    lVar10 = 0;
                                                    do {
                                                      lVar1 = *(long *)((long)local_158 + lVar10);
                                                      cVar2 = QTest::qCompare(*(longlong *)
                                                                               (lVar1 + 0x20),1,
                                                                              "spy->count()","1",
                                                                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x73c);
                                                  if (cVar2 == '\0') break;
                                                  QList<QList<QVariant>_>::takeFirst
                                                            ((value_type *)&local_1e8,
                                                             (QList<QList<QVariant>_> *)
                                                             (lVar1 + 0x10));
                                                  QVariant::value<QModelIndex>
                                                            ((QModelIndex *)&local_1c0,
                                                             (QVariant *)local_1e8._8_8_);
                                                  bVar4 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                    ((QModelIndex *)&local_1c0,
                                                                     &local_190,
                                                                                                                                          
                                                  "args.at(0).value<QModelIndex>()","parIndex",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x73e);
                                                  if (!bVar4) {
LAB_001270e7:
                                                    QArrayDataPointer<QVariant>::~QArrayDataPointer
                                                              ((QArrayDataPointer<QVariant> *)
                                                               &local_1e8);
                                                    break;
                                                  }
                                                  iVar5 = QVariant::toInt((bool *)(local_1e8._8_8_ +
                                                                                  0x20));
                                                  cVar2 = QTest::qCompare(iVar5,2,
                                                  "args.at(1).toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x73f);
                                                  if (cVar2 == '\0') goto LAB_001270e7;
                                                  iVar5 = QVariant::toInt((bool *)(local_1e8._8_8_ +
                                                                                  0x40));
                                                  cVar2 = QTest::qCompare(iVar5,2,
                                                  "args.at(2).toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x740);
                                                  if (cVar2 == '\0') goto LAB_001270e7;
                                                  QVariant::value<QModelIndex>
                                                            ((QModelIndex *)&local_1c0,
                                                             (QVariant *)(local_1e8._8_8_ + 0x60));
                                                  bVar4 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                    ((QModelIndex *)&local_1c0,
                                                                     &local_170,
                                                                                                                                          
                                                  "args.at(3).value<QModelIndex>()","destIndex",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x741);
                                                  if (!bVar4) goto LAB_001270e7;
                                                  iVar5 = QVariant::toInt((bool *)(local_1e8._8_8_ +
                                                                                  0x80));
                                                  bVar3 = QTest::qCompare(iVar5,0,
                                                  "args.at(4).toInt()","0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x742);
                                                  QArrayDataPointer<QVariant>::~QArrayDataPointer
                                                            ((QArrayDataPointer<QVariant> *)
                                                             &local_1e8);
                                                  bVar4 = lVar10 != 8;
                                                  lVar10 = lVar10 + 8;
                                                  } while ((bVar3 & bVar4) != 0);
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              QPersistentModelIndex::~QPersistentModelIndex(local_178);
            }
          }
        }
      }
    }
LAB_001270fe:
    local_b0._0_8_ = &PTR_metaObject_00165910;
    QObject::~QObject((QObject *)((long)&local_b0 + 0x58));
    if (&(local_b0.args.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b0.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b0.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b0.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_b0.args.d.d)->super_QArrayData,4,8);
      }
    }
    if (&(local_b0.sig.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b0.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b0.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b0.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b0.sig.d.d)->super_QArrayData,1,8);
      }
    }
    QArrayDataPointer<QList<QVariant>_>::~QArrayDataPointer
              ((QArrayDataPointer<QList<QVariant>_> *)((long)&local_b0 + 0x10));
    QObject::~QObject(&local_b0.super_QObject);
  }
  local_130._0_8_ = &PTR_metaObject_00165910;
  QObject::~QObject((QObject *)((long)&local_130 + 0x58));
  if (&(local_130.args.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_130.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_130.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_130.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_130.args.d.d)->super_QArrayData,4,8);
    }
  }
  if (&(local_130.sig.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_130.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_130.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_130.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_130.sig.d.d)->super_QArrayData,1,8);
    }
  }
  QArrayDataPointer<QList<QVariant>_>::~QArrayDataPointer
            ((QArrayDataPointer<QList<QVariant>_> *)((long)&local_130 + 0x10));
  QObject::~QObject(&local_130.super_QObject);
  QObject::~QObject((QObject *)local_140);
  GenericModel::~GenericModel((GenericModel *)&local_1a8);
  return;
}

Assistant:

void tst_GenericModel::moveRowsNewBranch()
{
    GenericModel testModel;
    ModelTest probe(&testModel, nullptr);
    testModel.insertColumns(0, 2);
    testModel.insertRows(0, 3);
    const QModelIndex parIndex = testModel.index(1, 0);
    const QModelIndex destIndex = testModel.index(2, 0);
    testModel.insertColumns(0, 2, parIndex);
    testModel.insertRows(0, 6, parIndex);
    QSignalSpy rowsAboutToBeMovedSpy(&testModel, SIGNAL(rowsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(rowsAboutToBeMovedSpy.isValid());
    QSignalSpy rowsMovedSpy(&testModel, SIGNAL(rowsMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(rowsMovedSpy.isValid());
    QSignalSpy *spyArr[] = {&rowsAboutToBeMovedSpy, &rowsMovedSpy};
    for (int i = 0; i < 6; ++i) {
        testModel.setData(testModel.index(i, 0, parIndex), i);
        testModel.setData(testModel.index(i, 1, parIndex), QChar('a' + i));
    }
    QVERIFY(!testModel.moveRows(parIndex, 2, 1, destIndex, -1));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(parIndex, 2, 1, destIndex, 1));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(parIndex, -1, 1, destIndex, 0));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(parIndex, 6, 1, destIndex, 0));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);

    QPersistentModelIndex twoIndex = testModel.index(2, 1, parIndex);
    QVERIFY(testModel.moveRows(parIndex, 2, 1, destIndex, 0));
    QCOMPARE(testModel.rowCount(destIndex), 1);
    QCOMPARE(testModel.columnCount(destIndex), 2);
    QCOMPARE(testModel.rowCount(parIndex), 5);
    QCOMPARE(testModel.index(0, 0, destIndex).data().toInt(), 2);
    QCOMPARE(testModel.index(0, 0, parIndex).data().toInt(), 0);
    QCOMPARE(testModel.index(1, 0, parIndex).data().toInt(), 1);
    QCOMPARE(testModel.index(2, 0, parIndex).data().toInt(), 3);
    QCOMPARE(testModel.index(3, 0, parIndex).data().toInt(), 4);
    QCOMPARE(testModel.index(4, 0, parIndex).data().toInt(), 5);
    QCOMPARE(testModel.index(0, 1, destIndex).data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(testModel.index(0, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('a')));
    QCOMPARE(testModel.index(1, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('b')));
    QCOMPARE(testModel.index(2, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('d')));
    QCOMPARE(testModel.index(3, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('e')));
    QCOMPARE(testModel.index(4, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('f')));
    QCOMPARE(twoIndex.data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(twoIndex.row(), 0);
    QCOMPARE(twoIndex.parent(), destIndex);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(0).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(1).toInt(), 2);
        QCOMPARE(args.at(2).toInt(), 2);
        QCOMPARE(args.at(3).value<QModelIndex>(), destIndex);
        QCOMPARE(args.at(4).toInt(), 0);
    }
}